

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Joint::Joint(Joint *this,Skeleton *s)

{
  Vector3D local_58;
  Vector3D local_40;
  Skeleton *local_18;
  Skeleton *s_local;
  Joint *this_local;
  
  local_18 = s;
  s_local = (Skeleton *)this;
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00394820;
  std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::vector
            (&this->kids);
  Vector3D::Vector3D(&this->axis);
  Vector3D::Vector3D(&this->ikAngleGradient);
  this->skeleton = local_18;
  this->capsuleRadius = 0.05;
  this->renderScale = 1.0;
  Vector3D::Vector3D(&local_40,1.0,1.0,1.0);
  (this->super_SceneObject).scale.z = local_40.z;
  (this->super_SceneObject).scale.x = local_40.x;
  (this->super_SceneObject).scale.y = local_40.y;
  Vector3D::Vector3D(&local_58,&(this->super_SceneObject).scale);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,0.0,&local_58);
  return;
}

Assistant:

Joint :: Joint(Skeleton * s)
   : skeleton( s ), capsuleRadius( 0.05 ), renderScale( 1.0 )
   {
     scale = Vector3D(1., 1., 1.);
     scales.setValue(0, scale);
   }